

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datalogProgram.cpp
# Opt level: O0

DatalogProgram * __thiscall DatalogProgram::toString_abi_cxx11_(DatalogProgram *this)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  reference pbVar4;
  string *in_RSI;
  _Self local_1b0;
  _Base_ptr local_1a8;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a0;
  iterator it;
  string local_190 [32];
  undefined1 local_170 [40];
  vector<Predicate_*,_std::allocator<Predicate_*>_> local_148;
  undefined1 local_128 [32];
  Rule local_108;
  uint local_e8;
  allocator local_e1;
  uint i;
  undefined1 local_c0 [40];
  vector<Predicate_*,_std::allocator<Predicate_*>_> local_98;
  undefined1 local_78 [56];
  vector<Predicate_*,_std::allocator<Predicate_*>_> local_40;
  undefined1 local_19;
  DatalogProgram *this_local;
  string *res;
  
  local_19 = 0;
  this_local = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"Schemes",(allocator *)(local_78 + 0x37));
  pred_list_str(this,in_RSI,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)(local_78 + 0x37));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_98,"Facts",(allocator *)(local_c0 + 0x27));
  pred_list_str((DatalogProgram *)local_78,in_RSI,&local_98);
  std::__cxx11::string::operator+=((string *)this,(string *)local_78);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)(local_c0 + 0x27));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&i,"Rules",&local_e1);
  std::vector<Rule_*,_std::allocator<Rule_*>_>::size
            ((vector<Rule_*,_std::allocator<Rule_*>_> *)(in_RSI + 0x18));
  lheader((DatalogProgram *)local_c0,in_RSI,(int)&i);
  std::__cxx11::string::operator+=((string *)this,(string *)local_c0);
  std::__cxx11::string::~string((string *)local_c0);
  std::__cxx11::string::~string((string *)&i);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  for (local_e8 = 0; uVar2 = (ulong)local_e8,
      sVar3 = std::vector<Rule_*,_std::allocator<Rule_*>_>::size
                        ((vector<Rule_*,_std::allocator<Rule_*>_> *)(in_RSI + 0x18)), uVar2 < sVar3;
      local_e8 = local_e8 + 1) {
    std::__cxx11::string::operator+=((string *)this,"  ");
    std::vector<Rule_*,_std::allocator<Rule_*>_>::operator[]
              ((vector<Rule_*,_std::allocator<Rule_*>_> *)(in_RSI + 0x18),(ulong)local_e8);
    Rule::toString_abi_cxx11_((Rule *)(local_128 + 0x20));
    std::__cxx11::string::operator+=((string *)this,(string *)(local_128 + 0x20));
    std::__cxx11::string::~string((string *)(local_128 + 0x20));
    std::__cxx11::string::operator+=((string *)this,"\n");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_148,"Queries",(allocator *)(local_170 + 0x27));
  pred_list_str((DatalogProgram *)local_128,in_RSI,&local_148);
  std::__cxx11::string::operator+=((string *)this,(string *)local_128);
  std::__cxx11::string::~string((string *)local_128);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator((allocator<char> *)(local_170 + 0x27));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_190,"Domain",(allocator *)((long)&it._M_node + 7));
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::size((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)(in_RSI + 0x60));
  lheader((DatalogProgram *)local_170,in_RSI,(int)local_190);
  std::__cxx11::string::operator+=((string *)this,(string *)local_170);
  std::__cxx11::string::~string((string *)local_170);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_node + 7));
  std::
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_Rb_tree_const_iterator(&local_1a0);
  local_1a8 = (_Base_ptr)
              std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(in_RSI + 0x60));
  local_1a0._M_node = local_1a8;
  while( true ) {
    local_1b0._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(in_RSI + 0x60));
    bVar1 = std::operator!=(&local_1a0,&local_1b0);
    if (!bVar1) break;
    std::__cxx11::string::operator+=((string *)this,"  ");
    pbVar4 = std::
             _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_1a0);
    std::__cxx11::string::operator+=((string *)this,(string *)pbVar4);
    std::__cxx11::string::operator+=((string *)this,"\n");
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_1a0);
  }
  return this;
}

Assistant:

string DatalogProgram::toString()
{
  string res = pred_list_str("Schemes", schemes);
  res += pred_list_str("Facts", facts);
  res += lheader((string)"Rules", rules.size());

  for (unsigned int i = 0; i < rules.size(); i++) {
    res += "  ";
    res += rules[i]->toString();
    res += "\n";
  }

  res += pred_list_str("Queries", queries);

  res += lheader("Domain", domain.size());
  set<string>::iterator it;
  for (it = domain.begin(); it != domain.end(); ++it)
  {
    res += "  ";
    res += *it;
    res += "\n";
  }
  return res;
}